

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addTorsion(Molecule *this,Torsion *torsion)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *in_RDI;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::begin(in_RDI);
  __val = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::Torsion**,std::vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>>>,OpenMD::Torsion*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::push_back
              ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)__last._M_current,
               __val._M_current);
  }
  return;
}

Assistant:

void Molecule::addTorsion(Torsion* torsion) {
    if (std::find(torsions_.begin(), torsions_.end(), torsion) ==
        torsions_.end()) {
      torsions_.push_back(torsion);
    }
  }